

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall
backward::TraceResolverLinuxBase::~TraceResolverLinuxBase(TraceResolverLinuxBase *this)

{
  ~TraceResolverLinuxBase(this);
  operator_delete(this);
  return;
}

Assistant:

TraceResolverLinuxBase()
      : argv0_(get_argv0()), exec_path_(read_symlink("/proc/self/exe")) {}